

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sq.c
# Opt level: O1

void crypto_sign_ed25519_ref10_fe_sq(int32_t *h,int32_t *f)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  
  lVar7 = (long)*f;
  lVar17 = (long)f[1];
  lVar21 = (long)f[2];
  lVar14 = (long)f[3];
  lVar8 = (long)f[5];
  lVar28 = (long)f[6];
  lVar23 = lVar7 * 2;
  lVar30 = lVar17 * 2;
  lVar4 = lVar8 * 2;
  lVar10 = (long)f[7];
  lVar5 = lVar14 * 2;
  lVar24 = (long)f[4];
  lVar20 = lVar21 * 2;
  lVar19 = (long)f[8];
  lVar25 = lVar10 * 0x26;
  lVar27 = lVar10 * 2;
  lVar3 = lVar19 * 0x13;
  lVar22 = (long)f[9];
  lVar13 = lVar22 * 0x26;
  lVar6 = lVar24 * 2;
  lVar2 = lVar28 * 0x13;
  lVar15 = lVar8 * lVar8 * 0x26 + lVar2 * lVar6 + lVar7 * lVar7 + lVar25 * lVar5 + lVar20 * lVar3 +
           lVar30 * lVar13;
  lVar26 = lVar25 * lVar10 + lVar21 * lVar21 + lVar5 * lVar30 + lVar24 * lVar23 + lVar28 * lVar3 * 2
           + lVar4 * lVar13;
  uVar12 = lVar15 + 0x2000000;
  lVar11 = ((long)uVar12 >> 0x1a) +
           lVar2 * lVar4 + lVar23 * lVar17 + lVar25 * lVar24 + lVar3 * lVar5 + lVar21 * lVar13;
  uVar1 = lVar26 + 0x2000000;
  lVar29 = ((long)uVar1 >> 0x1a) +
           lVar3 * lVar27 + lVar20 * lVar14 + lVar24 * lVar30 + lVar8 * lVar23 + lVar13 * lVar28;
  lVar7 = lVar11 + 0x1000000;
  lVar18 = (lVar7 >> 0x19) +
           lVar2 * lVar28 + lVar17 * lVar30 + lVar21 * lVar23 + lVar25 * lVar4 +
           lVar6 * lVar3 + lVar5 * lVar13;
  lVar2 = lVar29 + 0x1000000;
  lVar9 = (lVar2 >> 0x19) +
          lVar3 * lVar19 + lVar14 * lVar5 + lVar24 * lVar20 + lVar4 * lVar30 + lVar28 * lVar23 +
          lVar27 * lVar13;
  lVar17 = lVar18 + 0x2000000;
  lVar25 = (lVar17 >> 0x1a) +
           lVar25 * lVar28 + lVar3 * lVar4 + lVar30 * lVar21 + lVar14 * lVar23 + lVar24 * lVar13;
  lVar3 = lVar9 + 0x2000000;
  lVar16 = (lVar3 >> 0x1a) +
           lVar19 * lVar13 + lVar5 * lVar24 + lVar8 * lVar20 + lVar28 * lVar30 + lVar10 * lVar23;
  lVar14 = lVar25 + 0x1000000;
  lVar26 = (lVar14 >> 0x19) + (lVar26 - (uVar1 & 0xfffffffffc000000));
  lVar21 = lVar16 + 0x1000000;
  lVar27 = (lVar21 >> 0x19) +
           lVar13 * lVar22 +
           lVar24 * lVar24 + lVar28 * lVar20 + lVar4 * lVar5 + lVar27 * lVar30 + lVar19 * lVar23;
  uVar1 = lVar26 + 0x2000000;
  lVar4 = lVar27 + 0x2000000;
  lVar30 = (lVar4 >> 0x1a) +
           lVar8 * lVar6 + lVar28 * lVar5 + lVar10 * lVar20 + lVar19 * lVar30 + lVar23 * lVar22;
  lVar23 = lVar30 + 0x1000000;
  lVar20 = (lVar23 >> 0x19) * 0x13 + (lVar15 - (uVar12 & 0xfffffffffc000000));
  uVar12 = lVar20 + 0x2000000;
  *h = (int)lVar20 - ((uint)uVar12 & 0xfc000000);
  h[1] = (int)(uVar12 >> 0x1a) + ((int)lVar11 - ((uint)lVar7 & 0xfe000000));
  h[2] = (int)lVar18 - ((uint)lVar17 & 0xfc000000);
  h[3] = (int)lVar25 - ((uint)lVar14 & 0xfe000000);
  h[4] = (int)lVar26 - ((uint)uVar1 & 0xfc000000);
  h[5] = (int)(uVar1 >> 0x1a) + ((int)lVar29 - ((uint)lVar2 & 0xfe000000));
  h[6] = (int)lVar9 - ((uint)lVar3 & 0xfc000000);
  h[7] = (int)lVar16 - ((uint)lVar21 & 0xfe000000);
  h[8] = (int)lVar27 - ((uint)lVar4 & 0xfc000000);
  h[9] = (int)lVar30 - ((uint)lVar23 & 0xfe000000);
  return;
}

Assistant:

void fe_sq(fe h,const fe f)
{
  crypto_int32 f0 = f[0];
  crypto_int32 f1 = f[1];
  crypto_int32 f2 = f[2];
  crypto_int32 f3 = f[3];
  crypto_int32 f4 = f[4];
  crypto_int32 f5 = f[5];
  crypto_int32 f6 = f[6];
  crypto_int32 f7 = f[7];
  crypto_int32 f8 = f[8];
  crypto_int32 f9 = f[9];
  crypto_int32 f0_2 = 2 * f0;
  crypto_int32 f1_2 = 2 * f1;
  crypto_int32 f2_2 = 2 * f2;
  crypto_int32 f3_2 = 2 * f3;
  crypto_int32 f4_2 = 2 * f4;
  crypto_int32 f5_2 = 2 * f5;
  crypto_int32 f6_2 = 2 * f6;
  crypto_int32 f7_2 = 2 * f7;
  crypto_int32 f5_38 = 38 * f5; /* 1.959375*2^30 */
  crypto_int32 f6_19 = 19 * f6; /* 1.959375*2^30 */
  crypto_int32 f7_38 = 38 * f7; /* 1.959375*2^30 */
  crypto_int32 f8_19 = 19 * f8; /* 1.959375*2^30 */
  crypto_int32 f9_38 = 38 * f9; /* 1.959375*2^30 */
  crypto_int64 f0f0    = f0   * (crypto_int64) f0;
  crypto_int64 f0f1_2  = f0_2 * (crypto_int64) f1;
  crypto_int64 f0f2_2  = f0_2 * (crypto_int64) f2;
  crypto_int64 f0f3_2  = f0_2 * (crypto_int64) f3;
  crypto_int64 f0f4_2  = f0_2 * (crypto_int64) f4;
  crypto_int64 f0f5_2  = f0_2 * (crypto_int64) f5;
  crypto_int64 f0f6_2  = f0_2 * (crypto_int64) f6;
  crypto_int64 f0f7_2  = f0_2 * (crypto_int64) f7;
  crypto_int64 f0f8_2  = f0_2 * (crypto_int64) f8;
  crypto_int64 f0f9_2  = f0_2 * (crypto_int64) f9;
  crypto_int64 f1f1_2  = f1_2 * (crypto_int64) f1;
  crypto_int64 f1f2_2  = f1_2 * (crypto_int64) f2;
  crypto_int64 f1f3_4  = f1_2 * (crypto_int64) f3_2;
  crypto_int64 f1f4_2  = f1_2 * (crypto_int64) f4;
  crypto_int64 f1f5_4  = f1_2 * (crypto_int64) f5_2;
  crypto_int64 f1f6_2  = f1_2 * (crypto_int64) f6;
  crypto_int64 f1f7_4  = f1_2 * (crypto_int64) f7_2;
  crypto_int64 f1f8_2  = f1_2 * (crypto_int64) f8;
  crypto_int64 f1f9_76 = f1_2 * (crypto_int64) f9_38;
  crypto_int64 f2f2    = f2   * (crypto_int64) f2;
  crypto_int64 f2f3_2  = f2_2 * (crypto_int64) f3;
  crypto_int64 f2f4_2  = f2_2 * (crypto_int64) f4;
  crypto_int64 f2f5_2  = f2_2 * (crypto_int64) f5;
  crypto_int64 f2f6_2  = f2_2 * (crypto_int64) f6;
  crypto_int64 f2f7_2  = f2_2 * (crypto_int64) f7;
  crypto_int64 f2f8_38 = f2_2 * (crypto_int64) f8_19;
  crypto_int64 f2f9_38 = f2   * (crypto_int64) f9_38;
  crypto_int64 f3f3_2  = f3_2 * (crypto_int64) f3;
  crypto_int64 f3f4_2  = f3_2 * (crypto_int64) f4;
  crypto_int64 f3f5_4  = f3_2 * (crypto_int64) f5_2;
  crypto_int64 f3f6_2  = f3_2 * (crypto_int64) f6;
  crypto_int64 f3f7_76 = f3_2 * (crypto_int64) f7_38;
  crypto_int64 f3f8_38 = f3_2 * (crypto_int64) f8_19;
  crypto_int64 f3f9_76 = f3_2 * (crypto_int64) f9_38;
  crypto_int64 f4f4    = f4   * (crypto_int64) f4;
  crypto_int64 f4f5_2  = f4_2 * (crypto_int64) f5;
  crypto_int64 f4f6_38 = f4_2 * (crypto_int64) f6_19;
  crypto_int64 f4f7_38 = f4   * (crypto_int64) f7_38;
  crypto_int64 f4f8_38 = f4_2 * (crypto_int64) f8_19;
  crypto_int64 f4f9_38 = f4   * (crypto_int64) f9_38;
  crypto_int64 f5f5_38 = f5   * (crypto_int64) f5_38;
  crypto_int64 f5f6_38 = f5_2 * (crypto_int64) f6_19;
  crypto_int64 f5f7_76 = f5_2 * (crypto_int64) f7_38;
  crypto_int64 f5f8_38 = f5_2 * (crypto_int64) f8_19;
  crypto_int64 f5f9_76 = f5_2 * (crypto_int64) f9_38;
  crypto_int64 f6f6_19 = f6   * (crypto_int64) f6_19;
  crypto_int64 f6f7_38 = f6   * (crypto_int64) f7_38;
  crypto_int64 f6f8_38 = f6_2 * (crypto_int64) f8_19;
  crypto_int64 f6f9_38 = f6   * (crypto_int64) f9_38;
  crypto_int64 f7f7_38 = f7   * (crypto_int64) f7_38;
  crypto_int64 f7f8_38 = f7_2 * (crypto_int64) f8_19;
  crypto_int64 f7f9_76 = f7_2 * (crypto_int64) f9_38;
  crypto_int64 f8f8_19 = f8   * (crypto_int64) f8_19;
  crypto_int64 f8f9_38 = f8   * (crypto_int64) f9_38;
  crypto_int64 f9f9_38 = f9   * (crypto_int64) f9_38;
  crypto_int64 h0 = f0f0  +f1f9_76+f2f8_38+f3f7_76+f4f6_38+f5f5_38;
  crypto_int64 h1 = f0f1_2+f2f9_38+f3f8_38+f4f7_38+f5f6_38;
  crypto_int64 h2 = f0f2_2+f1f1_2 +f3f9_76+f4f8_38+f5f7_76+f6f6_19;
  crypto_int64 h3 = f0f3_2+f1f2_2 +f4f9_38+f5f8_38+f6f7_38;
  crypto_int64 h4 = f0f4_2+f1f3_4 +f2f2   +f5f9_76+f6f8_38+f7f7_38;
  crypto_int64 h5 = f0f5_2+f1f4_2 +f2f3_2 +f6f9_38+f7f8_38;
  crypto_int64 h6 = f0f6_2+f1f5_4 +f2f4_2 +f3f3_2 +f7f9_76+f8f8_19;
  crypto_int64 h7 = f0f7_2+f1f6_2 +f2f5_2 +f3f4_2 +f8f9_38;
  crypto_int64 h8 = f0f8_2+f1f7_4 +f2f6_2 +f3f5_4 +f4f4   +f9f9_38;
  crypto_int64 h9 = f0f9_2+f1f8_2 +f2f7_2 +f3f6_2 +f4f5_2;
  crypto_int64 carry0;
  crypto_int64 carry1;
  crypto_int64 carry2;
  crypto_int64 carry3;
  crypto_int64 carry4;
  crypto_int64 carry5;
  crypto_int64 carry6;
  crypto_int64 carry7;
  crypto_int64 carry8;
  crypto_int64 carry9;

  carry0 = (h0 + (crypto_int64) (1<<25)) >> 26; h1 += carry0; h0 -= carry0 << 26;
  carry4 = (h4 + (crypto_int64) (1<<25)) >> 26; h5 += carry4; h4 -= carry4 << 26;

  carry1 = (h1 + (crypto_int64) (1<<24)) >> 25; h2 += carry1; h1 -= carry1 << 25;
  carry5 = (h5 + (crypto_int64) (1<<24)) >> 25; h6 += carry5; h5 -= carry5 << 25;

  carry2 = (h2 + (crypto_int64) (1<<25)) >> 26; h3 += carry2; h2 -= carry2 << 26;
  carry6 = (h6 + (crypto_int64) (1<<25)) >> 26; h7 += carry6; h6 -= carry6 << 26;

  carry3 = (h3 + (crypto_int64) (1<<24)) >> 25; h4 += carry3; h3 -= carry3 << 25;
  carry7 = (h7 + (crypto_int64) (1<<24)) >> 25; h8 += carry7; h7 -= carry7 << 25;

  carry4 = (h4 + (crypto_int64) (1<<25)) >> 26; h5 += carry4; h4 -= carry4 << 26;
  carry8 = (h8 + (crypto_int64) (1<<25)) >> 26; h9 += carry8; h8 -= carry8 << 26;

  carry9 = (h9 + (crypto_int64) (1<<24)) >> 25; h0 += carry9 * 19; h9 -= carry9 << 25;

  carry0 = (h0 + (crypto_int64) (1<<25)) >> 26; h1 += carry0; h0 -= carry0 << 26;

  h[0] = h0;
  h[1] = h1;
  h[2] = h2;
  h[3] = h3;
  h[4] = h4;
  h[5] = h5;
  h[6] = h6;
  h[7] = h7;
  h[8] = h8;
  h[9] = h9;
}